

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void Fl_Text_Display::buffer_modified_cb
               (int pos,int nInserted,int nDeleted,int nRestyled,char *deletedText,void *cbArg)

{
  Fl_Text_Buffer *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Text_Selection *this;
  int local_84;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int wrapModEnd;
  int wrapModStart;
  int origCursorPos;
  int scrolled;
  int oldFirstChar;
  Fl_Text_Buffer *buf;
  Fl_Text_Display *textD;
  int endDispPos;
  int startDispPos;
  int linesDeleted;
  int linesInserted;
  void *cbArg_local;
  char *deletedText_local;
  int nRestyled_local;
  int nDeleted_local;
  int nInserted_local;
  int pos_local;
  
  _scrolled = *(Fl_Text_Buffer **)((long)cbArg + 0xd0);
  origCursorPos = *(int *)((long)cbArg + 0xe0);
  wrapModEnd = *(int *)((long)cbArg + 0xb0);
  local_58 = 0;
  local_5c = 0;
  if ((nInserted != 0) || (nDeleted != 0)) {
    *(undefined4 *)((long)cbArg + 0xc4) = 0xffffffff;
  }
  buf = (Fl_Text_Buffer *)cbArg;
  _linesDeleted = cbArg;
  cbArg_local = deletedText;
  deletedText_local._0_4_ = nRestyled;
  deletedText_local._4_4_ = nDeleted;
  nRestyled_local = nInserted;
  nDeleted_local = pos;
  if (*(int *)((long)cbArg + 0xe8) == 0) {
    if (nInserted == 0) {
      local_60 = 0;
    }
    else {
      local_60 = Fl_Text_Buffer::count_lines(_scrolled,pos,pos + nInserted);
    }
    startDispPos = local_60;
    if (deletedText_local._4_4_ == 0) {
      local_64 = 0;
    }
    else {
      local_64 = countlines((char *)cbArg_local);
    }
    endDispPos = local_64;
  }
  else {
    find_wrap_range((Fl_Text_Display *)cbArg,deletedText,pos,nInserted,nDeleted,&local_58,&local_5c,
                    &startDispPos,&endDispPos);
  }
  if ((nRestyled_local == 0) && (deletedText_local._4_4_ == 0)) {
    wrapModStart = 0;
  }
  else if (buf[1].mNPredeleteProcs == 0) {
    update_line_starts((Fl_Text_Display *)buf,nDeleted_local,nRestyled_local,deletedText_local._4_4_
                       ,startDispPos,endDispPos,&wrapModStart);
  }
  else {
    update_line_starts((Fl_Text_Display *)buf,local_58,local_5c - local_58,
                       (deletedText_local._4_4_ - local_58) + (local_5c - nRestyled_local),
                       startDispPos,endDispPos,&wrapModStart);
  }
  iVar2 = maintaining_absolute_top_line_number((Fl_Text_Display *)buf);
  if ((iVar2 != 0) && ((nRestyled_local != 0 || (deletedText_local._4_4_ != 0)))) {
    if ((cbArg_local == (void *)0x0) || (origCursorPos <= nDeleted_local + deletedText_local._4_4_))
    {
      if (nDeleted_local < origCursorPos) {
        reset_absolute_top_line_number((Fl_Text_Display *)buf);
      }
    }
    else {
      iVar2 = Fl_Text_Buffer::count_lines(_scrolled,nDeleted_local,nDeleted_local + nRestyled_local)
      ;
      iVar3 = countlines((char *)cbArg_local);
      *(int *)((long)&buf[1].mPredeleteCbArgs + 4) =
           (iVar2 - iVar3) + *(int *)((long)&buf[1].mPredeleteCbArgs + 4);
    }
  }
  pFVar1 = buf;
  buf[1].mGapEnd = (startDispPos - endDispPos) + buf[1].mGapEnd;
  if (buf[1].mLength == -1) {
    if (nDeleted_local < buf[1].mHighlight.mStart) {
      if (buf[1].mHighlight.mStart < nDeleted_local + deletedText_local._4_4_) {
        buf[1].mHighlight.mStart = nDeleted_local;
      }
      else {
        buf[1].mHighlight.mStart =
             (nRestyled_local - deletedText_local._4_4_) + buf[1].mHighlight.mStart;
      }
    }
  }
  else {
    buf[1].mHighlight.mStart = buf[1].mLength;
    buf[1].mLength = -1;
  }
  iVar2 = Fl_Widget::x((Fl_Widget *)buf);
  iVar3 = Fl_Widget::y((Fl_Widget *)buf);
  iVar4 = Fl_Widget::w((Fl_Widget *)buf);
  iVar5 = Fl_Widget::h((Fl_Widget *)buf);
  (**(code **)(*(long *)pFVar1 + 0x20))(pFVar1,iVar2,iVar3,iVar4,iVar5);
  iVar2 = Fl_Widget::visible_r((Fl_Widget *)buf);
  if (iVar2 != 0) {
    if (wrapModStart == 0) {
      if (buf[1].mNPredeleteProcs == 0) {
        local_84 = nDeleted_local;
      }
      else {
        local_84 = local_58;
      }
      textD._4_4_ = local_84;
      if ((wrapModEnd == local_84) && (buf[1].mHighlight.mStart != local_84)) {
        iVar2 = Fl_Text_Buffer::prev_char_clipped(_scrolled,wrapModEnd);
        textD._4_4_ = min(local_84,iVar2);
      }
      pFVar1 = _scrolled;
      if (startDispPos == endDispPos) {
        if ((nRestyled_local == 0) && (deletedText_local._4_4_ == 0)) {
          textD._0_4_ = nDeleted_local + (int)deletedText_local;
        }
        else if (buf[1].mNPredeleteProcs == 0) {
          iVar2 = Fl_Text_Buffer::line_end(_scrolled,nDeleted_local + nRestyled_local);
          textD._0_4_ = Fl_Text_Buffer::next_char(pFVar1,iVar2);
        }
        else {
          textD._0_4_ = local_5c;
        }
        if (1 < startDispPos) {
          Fl_Widget::damage((Fl_Widget *)buf,'\x02');
        }
      }
      else {
        textD._0_4_ = Fl_Text_Buffer::next_char(_scrolled,*(int *)((long)&buf[1].mCbArgs + 4));
      }
      if (buf[1].mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
        extend_range_for_styles((Fl_Text_Display *)buf,(int *)((long)&textD + 4),(int *)&textD);
      }
      redisplay_range((Fl_Text_Display *)buf,textD._4_4_,(int)textD);
    }
    else {
      Fl_Widget::damage((Fl_Widget *)buf,'\x02');
      if (buf[1].mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
        this = Fl_Text_Buffer::primary_selection((Fl_Text_Buffer *)buf[1].mModifyProcs);
        Fl_Text_Selection::selected(this,false);
      }
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::buffer_modified_cb( int pos, int nInserted, int nDeleted,
                                         int nRestyled, const char *deletedText, void *cbArg ) {
  int linesInserted, linesDeleted, startDispPos, endDispPos;
  Fl_Text_Display *textD = ( Fl_Text_Display * ) cbArg;
  Fl_Text_Buffer *buf = textD->mBuffer;
  int oldFirstChar = textD->mFirstChar;
  int scrolled, origCursorPos = textD->mCursorPos;
  int wrapModStart = 0, wrapModEnd = 0;

  IS_UTF8_ALIGNED2(buf, pos)
  IS_UTF8_ALIGNED2(buf, oldFirstChar)

  /* buffer modification cancels vertical cursor motion column */
  if ( nInserted != 0 || nDeleted != 0 )
    textD->mCursorPreferredXPos = -1;

  /* Count the number of lines inserted and deleted, and in the case
   of continuous wrap mode, how much has changed */
  if (textD->mContinuousWrap) {
    textD->find_wrap_range(deletedText, pos, nInserted, nDeleted,
                           &wrapModStart, &wrapModEnd, &linesInserted, &linesDeleted);
  } else {
    linesInserted = nInserted == 0 ? 0 : buf->count_lines( pos, pos + nInserted );
    linesDeleted = nDeleted == 0 ? 0 : countlines( deletedText );
  }

  /* Update the line starts and mTopLineNum */
  if ( nInserted != 0 || nDeleted != 0 ) {
    if (textD->mContinuousWrap) {
      textD->update_line_starts( wrapModStart, wrapModEnd-wrapModStart,
                                nDeleted + pos-wrapModStart + (wrapModEnd-(pos+nInserted)),
                                linesInserted, linesDeleted, &scrolled );
    } else {
      textD->update_line_starts( pos, nInserted, nDeleted, linesInserted,
                                linesDeleted, &scrolled );
    }
  } else
    scrolled = 0;

  /* If we're counting non-wrapped lines as well, maintain the absolute
   (non-wrapped) line number of the text displayed */
  if (textD->maintaining_absolute_top_line_number() &&
      (nInserted != 0 || nDeleted != 0)) {
    if (deletedText && (pos + nDeleted < oldFirstChar))
      textD->mAbsTopLineNum += buf->count_lines(pos, pos + nInserted) -
                               countlines(deletedText);
    else if (pos < oldFirstChar)
      textD->reset_absolute_top_line_number();
  }

  /* Update the line count for the whole buffer */
  textD->mNBufferLines += linesInserted - linesDeleted;

  /* Update the cursor position */
  if ( textD->mCursorToHint != NO_HINT ) {
    textD->mCursorPos = textD->mCursorToHint;
    textD->mCursorToHint = NO_HINT;
  } else if ( textD->mCursorPos > pos ) {
    if ( textD->mCursorPos < pos + nDeleted )
      textD->mCursorPos = pos;
    else
      textD->mCursorPos += nInserted - nDeleted;
  }

  // refigure scrollbars & stuff
  textD->resize(textD->x(), textD->y(), textD->w(), textD->h());

  // don't need to do anything else if not visible?
  if (!textD->visible_r()) return;

  /* If the changes caused scrolling, re-paint everything and we're done. */
  if ( scrolled ) {
    textD->damage(FL_DAMAGE_EXPOSE);
    if ( textD->mStyleBuffer )   /* See comments in extendRangeForStyleMods */
      textD->mStyleBuffer->primary_selection()->selected(0);
    return;
  }

  /* If the changes didn't cause scrolling, decide the range of characters
   that need to be re-painted.  Also if the cursor position moved, be
   sure that the redisplay range covers the old cursor position so the
   old cursor gets erased, and erase the bits of the cursor which extend
   beyond the left and right edges of the text. */
  startDispPos = textD->mContinuousWrap ? wrapModStart : pos;
  IS_UTF8_ALIGNED2(buf, startDispPos)

  if ( origCursorPos == startDispPos && textD->mCursorPos != startDispPos )
    startDispPos = min( startDispPos, buf->prev_char_clipped(origCursorPos) );
  IS_UTF8_ALIGNED2(buf, startDispPos)

  if ( linesInserted == linesDeleted ) {
    if ( nInserted == 0 && nDeleted == 0 )
      endDispPos = pos + nRestyled;
    else {
      if (textD->mContinuousWrap)
        endDispPos = wrapModEnd;
      else
        endDispPos = buf->next_char(buf->line_end( pos + nInserted ));

      // CET - FIXME      if ( origCursorPos >= startDispPos &&
      //                ( origCursorPos <= endDispPos || endDispPos == buf->length() ) )
    }
    if (linesInserted > 1) {
      // textD->draw_line_numbers(false); // can't do this b/c not called from virtual draw();
      textD->damage(::FL_DAMAGE_EXPOSE);
    }
  } else {
    endDispPos = buf->next_char(textD->mLastChar);
    // CET - FIXME   if ( origCursorPos >= pos )
    /* If more than one line is inserted/deleted, a line break may have
     been inserted or removed in between, and the line numbers may
     have changed. If only one line is altered, line numbers cannot
     be affected (the insertion or removal of a line break always
     results in at least two lines being redrawn). */
    
    // Call draw_line_numbers() here to ensure line# is drawn
    // when hitting enter for new line -- LZA / STR #2621
    //textD->draw_line_numbers(true);    // no, can't call this here, not in draw() context -- ERCO / STR#2621
    //textD->damage(::FL_DAMAGE_EXPOSE);
  }
  IS_UTF8_ALIGNED2(buf, startDispPos)
  IS_UTF8_ALIGNED2(buf, endDispPos)

  /* If there is a style buffer, check if the modification caused additional
   changes that need to be redisplayed.  (Redisplaying separately would
   cause double-redraw on almost every modification involving styled
   text).  Extend the redraw range to incorporate style changes */
  if ( textD->mStyleBuffer )
    textD->extend_range_for_styles( &startDispPos, &endDispPos );
  IS_UTF8_ALIGNED2(buf, startDispPos)
  IS_UTF8_ALIGNED2(buf, endDispPos)

  /* Redisplay computed range */
  textD->redisplay_range( startDispPos, endDispPos );
}